

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O2

void __thiscall QCborValue::QCborValue(QCborValue *this,QLatin1StringView s)

{
  QCborContainerPrivate *this_00;
  
  *(undefined8 *)this = 0;
  this_00 = (QCborContainerPrivate *)operator_new(0x40);
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i = 0;
  this_00->usedData = 0;
  (this_00->data).d.d = (Data *)0x0;
  (this_00->elements).d.size = 0;
  (this_00->data).d.ptr = (char *)0x0;
  (this_00->data).d.size = 0;
  (this_00->elements).d.d = (Data *)0x0;
  (this_00->elements).d.ptr = (Element *)0x0;
  *(QCborContainerPrivate **)(this + 8) = this_00;
  *(undefined4 *)(this + 0x10) = 0x60;
  QCborContainerPrivate::append(this_00,s);
  **(undefined4 **)(this + 8) = 1;
  return;
}

Assistant:

QCborValue::QCborValue(QLatin1StringView s)
    : n(0), container(new QCborContainerPrivate), t(String)
{
    container->append(s);
    container->ref.storeRelaxed(1);
}